

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O2

int Gia_StaAreSharpVar(Gia_StaAre_t *p1,Gia_StaAre_t *p2,int nWords)

{
  int i;
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar6 = 0;
  uVar4 = (ulong)(uint)nWords;
  if (nWords < 1) {
    uVar4 = uVar6;
  }
  iVar3 = -1;
  do {
    if (uVar6 == uVar4) {
      return iVar3;
    }
    uVar5 = ((uint)(&p2[1].iPrev)[uVar6] >> 1 ^ (uint)(&p2[1].iPrev)[uVar6]) &
            ~((uint)(&p1[1].iPrev)[uVar6] >> 1 ^ (uint)(&p1[1].iPrev)[uVar6]) & 0x55555555;
    if (uVar5 != 0) {
      if (((uVar5 & uVar5 - 1) != 0) || (-1 < iVar3)) {
        return -1;
      }
      for (uVar1 = 0;
          (uVar2 = 0xffffffff, uVar1 != 0x20 && (uVar2 = uVar1, (uVar5 >> (uVar1 & 0x1f) & 1) == 0))
          ; uVar1 = uVar1 + 1) {
      }
      iVar3 = (int)uVar6 * 0x10 + (int)uVar2 / 2;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

static inline int Gia_StaAreSharpVar( Gia_StaAre_t * p1, Gia_StaAre_t * p2, int nWords )
{
    unsigned Word;
    int w, iVar = -1;
    for ( w = 0; w < nWords; w++ )
    {
        Word = (~(p1->pData[w] ^ (p1->pData[w] >> 1))) & (p2->pData[w] ^ (p2->pData[w] >> 1)) & 0x55555555;
        if ( Word == 0 )
            continue;
        if ( !Gia_WordHasOneBit(Word) )
            return -1;
        // has exactly one bit
        if ( iVar >= 0 )
            return -1;
        // the first variable of this type
        iVar = 16 * w + Gia_WordFindFirstBit( Word ) / 2;
    }
    return iVar;
}